

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArticulatedParts.cpp
# Opt level: O0

void __thiscall DIS::ArticulatedParts::unmarshal(ArticulatedParts *this,DataStream *dataStream)

{
  DataStream *dataStream_local;
  ArticulatedParts *this_local;
  
  DataStream::operator>>(dataStream,&this->_recordType);
  DataStream::operator>>(dataStream,&this->_changeIndicator);
  DataStream::operator>>(dataStream,&this->_partAttachedTo);
  DataStream::operator>>(dataStream,&this->_parameterType);
  DataStream::operator>>(dataStream,&this->_parameterValue);
  DataStream::operator>>(dataStream,&this->_padding);
  return;
}

Assistant:

void ArticulatedParts::unmarshal(DataStream& dataStream)
{
    dataStream >> _recordType;
    dataStream >> _changeIndicator;
    dataStream >> _partAttachedTo;
    dataStream >> _parameterType;
    dataStream >> _parameterValue;
    dataStream >> _padding;
}